

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O3

void __thiscall Game::Game(Game *this)

{
  undefined8 this_00;
  char cVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  Memento *mem;
  Player *this_01;
  Deal *this_02;
  int player_type;
  string *name_00;
  _Alloc_hider this_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long lVar5;
  string name;
  string list [4];
  undefined1 local_120 [56];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  Player *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  AdvancedConsole::Cursor::Cursor((Cursor *)local_d8,0,0,AC_ABSOLUTE);
  poVar3 = AdvancedConsole::operator<<((ostream *)&std::cout,(Cursor *)local_d8);
  AdvancedConsole::Erase::Erase((Erase *)local_120,AC_ALL,AC_SCREEN);
  AdvancedConsole::operator<<(poVar3,(Erase *)local_120);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Welcome to the Bridge Game.",0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  mem = Memento::loadFile(-1);
  if (mem != (Memento *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Do you want to load last game?",0x1e);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    local_d8._8_8_ = 0;
    local_c8._M_local_buf[0] = '\0';
    local_d8._0_8_ = &local_c8;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Yes(y) or No(n) : ",0x12);
    cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x20);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)local_d8,cVar1);
    iVar2 = std::__cxx11::string::compare(local_d8);
    if ((((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare(local_d8), iVar2 == 0)) ||
        (iVar2 = std::__cxx11::string::compare(local_d8), iVar2 == 0)) ||
       (iVar2 = std::__cxx11::string::compare(local_d8), iVar2 == 0)) {
      reset(this,mem);
      this_02 = (Deal *)operator_new(0x48);
      Deal::Deal(this_02,(array<Player_*,_4UL>)*&(this->_players)._M_elems,0);
      this->_currentDeal = this_02;
      Deal::reset(this_02,mem);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._0_8_ == &local_c8) {
        return;
      }
      operator_delete((void *)local_d8._0_8_);
      return;
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._0_8_ != &local_c8) {
      operator_delete((void *)local_d8._0_8_);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"You should choose either player is a human or a computer. ",0x3a
            );
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"If it is a computer, just press ENTER.",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"If it is a human, just type the player name.",0x2c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  local_d8._0_8_ = &local_c8;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)__rhs,"North","");
  local_b8[0] = (Player *)local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"East","");
  local_98 = local_88;
  local_120._32_8_ = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"South","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"West","");
  local_120._0_8_ = (long)local_120 + 0x10;
  local_120._8_8_ = (Player *)0x0;
  local_120[0x10] = 0;
  lVar5 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player ",7);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(__rhs->_M_dataplus)._M_p,__rhs->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," : ",3);
    cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x20);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)local_120,cVar1);
    if ((Player *)local_120._8_8_ == (Player *)0x0) {
LAB_001073fe:
      std::operator+(&local_50,"Computer ",__rhs);
      std::__cxx11::string::operator=((string *)local_120,(string *)&local_50);
      this_03._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      player_type = 1;
    }
    else {
      this_03._M_p = local_120;
      iVar2 = std::__cxx11::string::compare(this_03._M_p);
      player_type = 0;
      if (iVar2 == 0) goto LAB_001073fe;
    }
    this_01 = createPlayer((Game *)this_03._M_p,player_type);
    name_00 = (string *)(local_120 + 0x28);
    ((array<Player_*,_2UL> *)(local_120._32_8_ + 0x28))->_M_elems[lVar5 + -5] = this_01;
    local_120._40_8_ = local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)name_00,local_120._0_8_,
               (undefined1 *)
               ((long)&((Serializable *)local_120._8_8_)->_vptr_Serializable + local_120._0_8_));
    Player::setName(this_01,name_00);
    if ((Team *)local_120._40_8_ != (Team *)local_e8) {
      operator_delete((void *)local_120._40_8_);
    }
    this_00 = local_120._32_8_;
    lVar5 = lVar5 + 1;
    __rhs = __rhs + 1;
    if (lVar5 == 4) {
      init((Game *)local_120._32_8_,(EVP_PKEY_CTX *)name_00);
      makeMemento((Game *)this_00);
      if (local_120._0_8_ != (long)local_120 + 0x10) {
        operator_delete((void *)local_120._0_8_);
      }
      lVar5 = 0;
      do {
        if (local_68 + lVar5 != *(undefined1 **)((long)local_78 + lVar5)) {
          operator_delete(*(undefined1 **)((long)local_78 + lVar5));
        }
        lVar5 = lVar5 + -0x20;
      } while (lVar5 != -0x80);
      return;
    }
  } while( true );
}

Assistant:

Game::Game() {
    cout << AdvancedConsole::Cursor(0, 0) << AdvancedConsole::Erase();
    cout << "Welcome to the Bridge Game." << endl << endl;

    Memento *mem = Memento::loadFile();
    if (mem) {
        cout << "Do you want to load last game?" << endl;
        string q;
        cout << "Yes(y) or No(n) : ";
        getline(std::cin, q);
        if (q == "y" || q == "Y" || q == "yes" || q == "YES") {
            this->reset(mem);
            _currentDeal = new Deal(_players, 0);
            _currentDeal->reset(mem);
            return;
        }
        cout << endl;
    }

    cout << "You should choose either player is a human or a computer. " << endl;
    cout << "If it is a computer, just press ENTER." << endl;
    cout << "If it is a human, just type the player name." << endl << endl;

    string list[4] = {"North", "East", "South", "West"};
    string name;
    for (int i = 0; i < 4; i++) {
        cout << "Player " << list[i] << " : ";
        getline(std::cin, name);
        bool isComputer = name.empty() || name == "computer";
        if (isComputer) name = "Computer " + list[i];

        _players[i] = createPlayer(isComputer);
        _players[i]->setName(name);
    }


    init();
    makeMemento();
}